

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void pangram_suite::test_danish(void)

{
  long lVar1;
  char *pcVar2;
  value_type *pvVar3;
  undefined4 local_1ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  char input [105];
  decoder_type decoder;
  
  pcVar2 = 
  "\"Quizdeltagerne spiste jordb\\u00E6r med fl\\u00F8de, mens cirkusklovnen Wolther spillede p\\u00E5 xylofon\""
  ;
  pvVar3 = input;
  for (lVar1 = 0x69; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pvVar3 = *pcVar2;
    pcVar2 = pcVar2 + 1;
    pvVar3 = pvVar3 + 1;
  }
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<105ul>(&decoder,&input);
  local_1e8._M_dataplus._M_p._0_4_ = decoder.current.code;
  local_1ec = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x907,"void pangram_suite::test_danish()",&local_1e8,&local_1ec);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_1e8,&decoder);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[91]>
            ("decoder.string_value<std::string>()",anon_var_dwarf_6e04,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x908,"void pangram_suite::test_danish()",&local_1e8,anon_var_dwarf_6e10);
  std::__cxx11::string::~string((string *)&local_1e8);
  trial::protocol::json::detail::basic_decoder<char>::next(&decoder);
  local_1e8._M_dataplus._M_p._0_4_ = decoder.current.code;
  local_1ec = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x90a,"void pangram_suite::test_danish()",&local_1e8,&local_1ec);
  return;
}

Assistant:

void test_danish()
{
    const char input[] = "\"Quizdeltagerne spiste jordb\\u00E6r med fl\\u00F8de, mens cirkusklovnen Wolther spillede p\\u00E5 xylofon\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "Quizdeltagerne spiste jordbær med fløde, mens cirkusklovnen Wolther spillede på xylofon");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}